

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_BracketOperatorCrashing_Test<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_BracketOperatorCrashing_Test<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  key_type pcVar1;
  value_type *pvVar2;
  int i;
  int iVar3;
  int index;
  ValueType local_58;
  key_type local_50;
  char *local_48;
  int local_3c;
  key_type local_38;
  
  pcVar1 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)this,1);
  this_00 = &(this->
             super_HashtableAllTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  google::
  dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(&this_00->rep);
  *(bool *)((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.settings + 0x2a) = true;
  *(key_type *)
   ((long)&(this->
           super_HashtableAllTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           ).
           super_HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.
           super_BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.rep.key_info + 0x10) = pcVar1;
  local_3c = 0;
  do {
    iVar3 = 0x21;
    do {
      local_38 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                 ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                              *)this,iVar3);
      index = (int)&local_50;
      UniqueObjectHelper<std::pair<char_const*const,ValueType>>(index);
      local_58.s_ = "hi";
      ValueType::set_s(&local_58,local_48);
      pvVar2 = google::
               dense_hashtable<std::pair<char_const*const,ValueType>,char_const*,Hasher,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
               ::find_or_insert<ValueType,char_const*const&>
                         ((dense_hashtable<std::pair<char_const*const,ValueType>,char_const*,Hasher,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                           *)this_00,&local_38);
      ValueType::set_s(&pvVar2->second,local_58.s_);
      if (local_58.s_ != "hi") {
        free(local_58.s_);
      }
      local_58.s_ = "hi";
      if (local_48 != "hi") {
        free(local_48);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != 0x85);
    google::
    dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::clear_no_resize(&this_00->rep);
    local_38 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                            *)this,2);
    UniqueObjectHelper<std::pair<char_const*const,ValueType>>(index);
    local_58.s_ = "hi";
    ValueType::set_s(&local_58,local_48);
    pvVar2 = google::
             dense_hashtable<std::pair<char_const*const,ValueType>,char_const*,Hasher,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
             ::find_or_insert<ValueType,char_const*const&>
                       ((dense_hashtable<std::pair<char_const*const,ValueType>,char_const*,Hasher,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                         *)this_00,&local_38);
    ValueType::set_s(&pvVar2->second,local_58.s_);
    if (local_58.s_ != "hi") {
      free(local_58.s_);
    }
    iVar3 = local_3c;
    local_58.s_ = "hi";
    if (local_48 != "hi") {
      free(local_48);
    }
    local_50 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                            *)this,2);
    google::
    dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::erase(&this_00->rep,&local_50);
    local_3c = iVar3 + 1;
  } while (local_3c != 10);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, BracketOperatorCrashing) {
  this->ht_.set_deleted_key(this->UniqueKey(1));
  for (int iters = 0; iters < 10; iters++) {
    // We start at 33 because after shrinking, we'll be at 32 buckets.
    for (int i = 33; i < 133; i++) {
      this->ht_.bracket_assign(this->UniqueKey(i),
                               this->ht_.get_data(this->UniqueObject(i)));
    }
    this->ht_.clear_no_resize();
    // This will force a shrink on the next insert, which we want to test.
    this->ht_.bracket_assign(this->UniqueKey(2),
                             this->ht_.get_data(this->UniqueObject(2)));
    this->ht_.erase(this->UniqueKey(2));
  }
}